

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall helics::apps::App::loadConfigOptions(App *this,AppTextParser *aparser)

{
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  istringstream sstr;
  undefined1 local_190 [128];
  ios_base local_110 [264];
  
  if ((aparser->configStr)._M_string_length != 0) {
    generateParser((App *)local_190);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(local_190 + 8),(string *)&aparser->configStr,_S_in);
    CLI::App::parse_from_stream((App *)local_190._0_8_,(istream *)(local_190 + 8));
    std::__cxx11::istringstream::~istringstream((istringstream *)(local_190 + 8));
    std::ios_base::~ios_base(local_110);
    if ((App *)local_190._0_8_ != (App *)0x0) {
      (*(*(_func_int ***)local_190._0_8_)[1])();
    }
  }
  return;
}

Assistant:

void App::loadConfigOptions(AppTextParser& aparser)
{
    const auto& configStr = aparser.configString();
    if (!configStr.empty()) {
        auto app = generateParser();
        std::istringstream sstr(configStr);
        app->parse_from_stream(sstr);
    }
}